

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeMathObject
               (DynamicObject *mathObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *scriptContext_00;
  JavascriptLibrary *this;
  Var pvVar2;
  void **ppvVar3;
  Type *this_00;
  JavascriptFunction *pJVar4;
  ScriptConfiguration *pSVar5;
  JavascriptString *value;
  Type *builtinFuncs;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *mathObject_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,mathObject,mode,0x2a,0);
  scriptContext_00 = RecyclableObject::GetScriptContext(&mathObject->super_RecyclableObject);
  this = RecyclableObject::GetLibrary(&mathObject->super_RecyclableObject);
  pvVar2 = JavascriptNumber::New(2.718281828459045,scriptContext_00);
  AddMember(this,mathObject,0x75,pvVar2,'\0');
  pvVar2 = JavascriptNumber::New(2.302585092994046,scriptContext_00);
  AddMember(this,mathObject,0xd3,pvVar2,'\0');
  pvVar2 = JavascriptNumber::New(0.6931471805599453,scriptContext_00);
  AddMember(this,mathObject,0xd4,pvVar2,'\0');
  pvVar2 = JavascriptNumber::New(1.4426950408889634,scriptContext_00);
  AddMember(this,mathObject,0x29,pvVar2,'\0');
  pvVar2 = JavascriptNumber::New(0.4342944819032518,scriptContext_00);
  AddMember(this,mathObject,0x28,pvVar2,'\0');
  ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).pi);
  AddMember(this,mathObject,0x2b,*ppvVar3,'\0');
  pvVar2 = JavascriptNumber::New(0.7071067811865476,scriptContext_00);
  AddMember(this,mathObject,0x157,pvVar2,'\0');
  pvVar2 = JavascriptNumber::New(1.4142135623730951,scriptContext_00);
  AddMember(this,mathObject,0x158,pvVar2,'\0');
  this_00 = GetBuiltinFunctions(this);
  bVar1 = ScriptContext::IsJsBuiltInEnabled(scriptContext_00);
  if (bVar1) {
    EnsureBuiltInEngineIsReady(Math_object,scriptContext_00);
  }
  else {
    pJVar4 = AddFunctionToLibraryObject
                       (this,mathObject,0xfe,(FunctionInfo *)Math::EntryInfo::Max,2,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x24,pJVar4);
    pJVar4 = AddFunctionToLibraryObject
                       (this,mathObject,0x2a,(FunctionInfo *)Math::EntryInfo::Min,2,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x25,pJVar4);
  }
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x1d,(FunctionInfo *)Math::EntryInfo::Abs,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x1e,(FunctionInfo *)Math::EntryInfo::Acos,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 1,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x20,(FunctionInfo *)Math::EntryInfo::Asin,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 2,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x21,(FunctionInfo *)Math::EntryInfo::Atan,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 3,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x22,(FunctionInfo *)Math::EntryInfo::Atan2,2,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 4,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x24,(FunctionInfo *)Math::EntryInfo::Cos,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x20,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x23,(FunctionInfo *)Math::EntryInfo::Ceil,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 5,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x25,(FunctionInfo *)Math::EntryInfo::Exp,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x21,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x26,(FunctionInfo *)Math::EntryInfo::Floor,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x22,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x27,(FunctionInfo *)Math::EntryInfo::Log,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x23,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x2c,(FunctionInfo *)Math::EntryInfo::Pow,2,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x26,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x2d,(FunctionInfo *)Math::EntryInfo::Random,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x2b,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x2e,(FunctionInfo *)Math::EntryInfo::Round,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x2c,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x2f,(FunctionInfo *)Math::EntryInfo::Sin,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x2d,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x30,(FunctionInfo *)Math::EntryInfo::Sqrt,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x2e,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,mathObject,0x31,(FunctionInfo *)Math::EntryInfo::Tan,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x2f,pJVar4);
  pSVar5 = ScriptContext::GetConfig(scriptContext_00);
  bVar1 = ScriptConfiguration::IsES6MathExtensionsEnabled(pSVar5);
  if (bVar1) {
    pJVar4 = AddFunctionToLibraryObject
                       (this,mathObject,0x40,(FunctionInfo *)Math::EntryInfo::Imul,2,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x27,pJVar4);
    pJVar4 = AddFunctionToLibraryObject
                       (this,mathObject,0x42,(FunctionInfo *)Math::EntryInfo::Fround,1,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(this_00 + 0x42,pJVar4);
    AddFunctionToLibraryObject(this,mathObject,0x32,(FunctionInfo *)Math::EntryInfo::Log10,1,'\x06')
    ;
    AddFunctionToLibraryObject(this,mathObject,0x33,(FunctionInfo *)Math::EntryInfo::Log2,1,'\x06');
    AddFunctionToLibraryObject(this,mathObject,0x34,(FunctionInfo *)Math::EntryInfo::Log1p,1,'\x06')
    ;
    AddFunctionToLibraryObject(this,mathObject,0x35,(FunctionInfo *)Math::EntryInfo::Expm1,1,'\x06')
    ;
    AddFunctionToLibraryObject(this,mathObject,0x36,(FunctionInfo *)Math::EntryInfo::Cosh,1,'\x06');
    AddFunctionToLibraryObject(this,mathObject,0x37,(FunctionInfo *)Math::EntryInfo::Sinh,1,'\x06');
    AddFunctionToLibraryObject(this,mathObject,0x38,(FunctionInfo *)Math::EntryInfo::Tanh,1,'\x06');
    AddFunctionToLibraryObject(this,mathObject,0x39,(FunctionInfo *)Math::EntryInfo::Acosh,1,'\x06')
    ;
    AddFunctionToLibraryObject(this,mathObject,0x3a,(FunctionInfo *)Math::EntryInfo::Asinh,1,'\x06')
    ;
    AddFunctionToLibraryObject(this,mathObject,0x3b,(FunctionInfo *)Math::EntryInfo::Atanh,1,'\x06')
    ;
    AddFunctionToLibraryObject(this,mathObject,0x3c,(FunctionInfo *)Math::EntryInfo::Hypot,2,'\x06')
    ;
    AddFunctionToLibraryObject(this,mathObject,0x3d,(FunctionInfo *)Math::EntryInfo::Trunc,1,'\x06')
    ;
    AddFunctionToLibraryObject(this,mathObject,0x3e,(FunctionInfo *)Math::EntryInfo::Sign,1,'\x06');
    AddFunctionToLibraryObject(this,mathObject,0x3f,(FunctionInfo *)Math::EntryInfo::Cbrt,1,'\x06');
    AddFunctionToLibraryObject(this,mathObject,0x41,(FunctionInfo *)Math::EntryInfo::Clz32,1,'\x06')
    ;
  }
  pSVar5 = ScriptContext::GetConfig(scriptContext_00);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(pSVar5);
  if (bVar1) {
    value = CreateStringFromCppLiteral<5ul>(this,(char16 (*) [5])0x176b882);
    AddMember(this,mathObject,0x1b,value,'\x02');
  }
  CheckRegisteredBuiltIns(this_00,scriptContext_00);
  DynamicObject::SetHasNoEnumerableProperties(mathObject,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeMathObject(DynamicObject* mathObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(mathObject, mode, 42);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterMath
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = mathObject->GetScriptContext();
        JavascriptLibrary* library = mathObject->GetLibrary();

        library->AddMember(mathObject, PropertyIds::E,       JavascriptNumber::New(Math::E,       scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::LN10,    JavascriptNumber::New(Math::LN10,    scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::LN2,     JavascriptNumber::New(Math::LN2,     scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::LOG2E,   JavascriptNumber::New(Math::LOG2E,   scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::LOG10E,  JavascriptNumber::New(Math::LOG10E,  scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::PI,      library->pi,                                         PropertyNone);
        library->AddMember(mathObject, PropertyIds::SQRT1_2, JavascriptNumber::New(Math::SQRT1_2, scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::SQRT2,   JavascriptNumber::New(Math::SQRT2,   scriptContext), PropertyNone);

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            EnsureBuiltInEngineIsReady(JsBuiltInFile::Math_object, scriptContext);
        }
        else
#endif
        {
            builtinFuncs[BuiltinFunction::Math_Max] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::max, &Math::EntryInfo::Max, 2);
            builtinFuncs[BuiltinFunction::Math_Min] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::min, &Math::EntryInfo::Min, 2);
        }

        builtinFuncs[BuiltinFunction::Math_Abs]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::abs,    &Math::EntryInfo::Abs,    1);
        builtinFuncs[BuiltinFunction::Math_Acos]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::acos,   &Math::EntryInfo::Acos,   1);
        builtinFuncs[BuiltinFunction::Math_Asin]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::asin,   &Math::EntryInfo::Asin,   1);
        builtinFuncs[BuiltinFunction::Math_Atan]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::atan,   &Math::EntryInfo::Atan,   1);
        builtinFuncs[BuiltinFunction::Math_Atan2]  = library->AddFunctionToLibraryObject(mathObject, PropertyIds::atan2,  &Math::EntryInfo::Atan2,  2);
        builtinFuncs[BuiltinFunction::Math_Cos]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::cos,    &Math::EntryInfo::Cos,    1);
        builtinFuncs[BuiltinFunction::Math_Ceil]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::ceil,   &Math::EntryInfo::Ceil,   1);
        builtinFuncs[BuiltinFunction::Math_Exp]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::exp,    &Math::EntryInfo::Exp,    1);
        builtinFuncs[BuiltinFunction::Math_Floor]  = library->AddFunctionToLibraryObject(mathObject, PropertyIds::floor,  &Math::EntryInfo::Floor,  1);
        builtinFuncs[BuiltinFunction::Math_Log]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::log,    &Math::EntryInfo::Log,    1);
        builtinFuncs[BuiltinFunction::Math_Pow]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::pow,    &Math::EntryInfo::Pow,    2);
        builtinFuncs[BuiltinFunction::Math_Random] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::random, &Math::EntryInfo::Random, 0);
        builtinFuncs[BuiltinFunction::Math_Round]  = library->AddFunctionToLibraryObject(mathObject, PropertyIds::round,  &Math::EntryInfo::Round,  1);
        builtinFuncs[BuiltinFunction::Math_Sin]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::sin,    &Math::EntryInfo::Sin,    1);
        builtinFuncs[BuiltinFunction::Math_Sqrt]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::sqrt,   &Math::EntryInfo::Sqrt,   1);
        builtinFuncs[BuiltinFunction::Math_Tan]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::tan,    &Math::EntryInfo::Tan,    1);

        if (scriptContext->GetConfig()->IsES6MathExtensionsEnabled())
        {
            builtinFuncs[BuiltinFunction::Math_Imul] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::imul, &Math::EntryInfo::Imul, 2);
            builtinFuncs[BuiltinFunction::Math_Fround] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::fround, &Math::EntryInfo::Fround, 1);
            /*builtinFuncs[BuiltinFunction::Math_Log10] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::log10, &Math::EntryInfo::Log10, 1);
            /*builtinFuncs[BuiltinFunction::Math_Log2]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::log2,  &Math::EntryInfo::Log2,  1);
            /*builtinFuncs[BuiltinFunction::Math_Log1p] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::log1p, &Math::EntryInfo::Log1p, 1);
            /*builtinFuncs[BuiltinFunction::Math_Expm1] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::expm1, &Math::EntryInfo::Expm1, 1);
            /*builtinFuncs[BuiltinFunction::Math_Cosh]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::cosh,  &Math::EntryInfo::Cosh,  1);
            /*builtinFuncs[BuiltinFunction::Math_Sinh]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::sinh,  &Math::EntryInfo::Sinh,  1);
            /*builtinFuncs[BuiltinFunction::Math_Tanh]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::tanh,  &Math::EntryInfo::Tanh,  1);
            /*builtinFuncs[BuiltinFunction::Math_Acosh] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::acosh, &Math::EntryInfo::Acosh, 1);
            /*builtinFuncs[BuiltinFunction::Math_Asinh] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::asinh, &Math::EntryInfo::Asinh, 1);
            /*builtinFuncs[BuiltinFunction::Math_Atanh] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::atanh, &Math::EntryInfo::Atanh, 1);
            /*builtinFuncs[BuiltinFunction::Math_Hypot] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::hypot, &Math::EntryInfo::Hypot, 2);
            /*builtinFuncs[BuiltinFunction::Math_Trunc] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::trunc, &Math::EntryInfo::Trunc, 1);
            /*builtinFuncs[BuiltinFunction::Math_Sign]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::sign,  &Math::EntryInfo::Sign,  1);
            /*builtinFuncs[BuiltinFunction::Math_Cbrt]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::cbrt,  &Math::EntryInfo::Cbrt,  1);
            /*builtinFuncs[BuiltinFunction::Math_Clz32] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::clz32, &Math::EntryInfo::Clz32, 1);
        }

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(mathObject, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Math")), PropertyConfigurable);
        }

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        mathObject->SetHasNoEnumerableProperties(true);

        return true;
    }